

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::ExtensionDirectiveTestCaseGroup::ExtensionDirectiveTestCase::iterate
          (ExtensionDirectiveTestCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *log;
  ContextInfo *pCVar2;
  RenderContext *renderCtx;
  glUniform4fFunc p_Var3;
  int iVar4;
  GLenum GVar5;
  GLint GVar6;
  undefined4 extraout_var;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  char *pcVar9;
  TestError *this_00;
  GLSLVersion glslVersion;
  char *extensionDirective;
  long lVar10;
  bool bVar11;
  GLubyte result [4];
  string frgSrc;
  string directive;
  FBOSentry fbo;
  VertexArrayBinding posBinding;
  ShaderProgram p;
  allocator<char> local_29a;
  allocator<char> local_299;
  undefined1 local_298 [8];
  void *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  int local_270;
  string local_268;
  value_type local_248;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  FBOSentry local_1e8;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  int local_1a8;
  pointer local_1a0;
  pointer pbStack_198;
  int local_190;
  undefined1 *local_188;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  ShaderProgram local_100;
  Functions *pFVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pFVar7 = (Functions *)CONCAT44(extraout_var,iVar4);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1bba46e;
  pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
  _Var8 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                    ((pCVar2->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pCVar2->m_extensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var8._M_current ==
      (pCVar2->m_extensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  else {
    extensionDirective = (char *)0x0;
    local_1e8.m_gl = pFVar7;
    FBOSentry::init(&local_1e8,(EVP_PKEY_CTX *)&DAT_00000004);
    (*pFVar7->clearColor)(1.0,1.0,1.0,1.0);
    (*pFVar7->clear)(0x4000);
    std::operator+(&local_208,"#extension GL_KHR_blend_equation_advanced : ",&this->m_behaviourStr);
    pcVar9 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&local_228,(glcts *)"blend_support_multiply",pcVar9,local_208._M_dataplus._M_p,
               extensionDirective);
    renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
    GetDef2DVtxSrc_abi_cxx11_(&local_268,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_298,local_268._M_dataplus._M_p,&local_299);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_248,local_228._M_dataplus._M_p,&local_29a);
    local_120[0x10] = 0;
    local_120._17_8_ = 0;
    local_120._0_8_ = (pointer)0x0;
    local_120[8] = 0;
    local_120._9_7_ = 0;
    memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1d0,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1d0,(value_type *)local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1b8,&local_248);
    glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_1d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_120);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_140);
    lVar10 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1d0 + lVar10));
      lVar10 = lVar10 + -0x18;
    } while (lVar10 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_298 != (undefined1  [8])&local_288) {
      operator_delete((void *)local_298,(ulong)(local_288._M_allocated_capacity + 1));
    }
    paVar1 = &local_268.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    bVar11 = true;
    if (this->m_requireInfoLog == true) {
      bVar11 = ((*local_100.m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length != 0;
    }
    if (local_100.m_program.m_info.linkOk == false) {
      if (this->m_requireCompile == true) {
        glu::operator<<(log,&local_100);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Compile failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                   ,0x462);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      pcVar9 = "Fail. Expected info log.";
      if (bVar11 != false) {
        pcVar9 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar11 ^ 1),
                 pcVar9);
    }
    else {
      (*pFVar7->useProgram)(local_100.m_program.m_program);
      GVar5 = (*pFVar7->getError)();
      glu::checkError(GVar5,"Program failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                      ,0x46e);
      if (bVar11 == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail. No warnings were generated.");
      }
      else {
        (*pFVar7->disable)(0xbd0);
        (*pFVar7->enable)(0xbe2);
        (*pFVar7->blendEquation)(0x9294);
        GVar5 = (*pFVar7->getError)();
        glu::checkError(GVar5,"BlendEquation failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x47b);
        p_Var3 = pFVar7->uniform4f;
        GVar6 = (*pFVar7->getUniformLocation)(local_100.m_program.m_program,"uSrcCol");
        (*p_Var3)(GVar6,0.0,0.0,0.0,1.0);
        GVar5 = (*pFVar7->getError)();
        glu::checkError(GVar5,"Uniform failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x480);
        local_268._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"aPos","");
        local_298._0_4_ = 1;
        local_290 = (void *)((long)&local_288 + 8U);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_290,local_268._M_dataplus._M_p,
                   local_268._M_dataplus._M_p + local_268._M_string_length);
        local_270 = 0;
        local_1d0._0_4_ = local_298._0_4_;
        local_1c8._M_p = (pointer)&local_1b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,local_290,
                   (undefined1 *)((long)local_290 + local_288._M_allocated_capacity));
        local_1a8 = local_270;
        local_1a0 = (pointer)0x8;
        pbStack_198 = (pointer)0x400000002;
        local_190 = 0;
        local_188 = s_pos;
        if (local_290 != (void *)((long)&local_288 + 8U)) {
          operator_delete(local_290,local_288._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar1) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        GVar5 = (*pFVar7->getError)();
        glu::checkError(GVar5,"Attributes failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x483);
        local_298 = (undefined1  [8])0x600000000;
        local_290 = (void *)CONCAT44(local_290._4_4_,1);
        local_288._M_allocated_capacity = (size_type)s_indices;
        glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
                  (VertexArrayBinding *)local_1d0,(PrimitiveList *)local_298,(DrawUtilCallback *)0x0
                 );
        GVar5 = (*pFVar7->getError)();
        glu::checkError(GVar5,"Draw failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x487);
        local_298._0_4_ = 0x4030201;
        (*pFVar7->readPixels)(0,0,1,1,0x1908,0x1401,(PrimitiveList *)local_298);
        GVar5 = (*pFVar7->getError)();
        glu::checkError(GVar5,"Read pixels failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                        ,0x48c);
        pcVar9 = "Pass";
        if (local_298._0_4_ != 0xff000000) {
          pcVar9 = "Fail";
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   (uint)(local_298._0_4_ != 0xff000000),pcVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_p != &local_1b8) {
          operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
        }
      }
    }
    glu::ShaderProgram::~ShaderProgram(&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    FBOSentry::~FBOSentry(&local_1e8);
  }
  return STOP;
}

Assistant:

IterateResult iterate(void)
		{
			const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
			TestLog&			  log = m_testCtx.getLog();
			const int			  dim = 4;

			// Check that extension is supported.
			if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
				return STOP;
			}

			FBOSentry fbo(gl, dim, dim, GL_RGBA8);

			tcu::Vec4 dstCol(1.f, 1.f, 1.f, 1.f);
			tcu::Vec4 srcCol(0.f, 0.f, 0.f, 1.f);

			// Clear to destination color.
			gl.clearColor(dstCol.x(), dstCol.y(), dstCol.z(), dstCol.w());
			gl.clear(GL_COLOR_BUFFER_BIT);

			// Setup program.
			std::string directive = "#extension GL_KHR_blend_equation_advanced : " + m_behaviourStr;
			std::string frgSrc = GetSolidShader("blend_support_multiply", glu::getGLSLVersionDeclaration(m_glslVersion),
												directive.c_str());
			glu::ShaderProgram p(m_context.getRenderContext(),
								 glu::makeVtxFragSources(GetDef2DVtxSrc(m_glslVersion).c_str(), frgSrc.c_str()));
			// If check that there is some info log if it is expected.
			const bool infoLogOk =
				m_requireInfoLog ? p.getShaderInfo(glu::SHADERTYPE_FRAGMENT).infoLog.size() > 0 : true;
			if (!p.isOk())
			{
				if (m_requireCompile)
				{
					log << p;
					TCU_FAIL("Compile failed");
				}
				else
				{
					// If shader was expected to fail, so assume info log has something.
					bool pass = infoLogOk;
					m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
											pass ? "Pass" : "Fail. Expected info log.");
				}
				return STOP;
			}
			gl.useProgram(p.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

			// Program ok, check whether info log was as expected.
			if (!infoLogOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail. No warnings were generated.");
				return STOP;
			}

			// Enable blending and set blend equation.
			gl.disable(GL_DITHER);
			gl.enable(GL_BLEND);
			gl.blendEquation(GL_MULTIPLY_KHR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

			// Setup source color.
			gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol.x(), srcCol.y(), srcCol.z(),
						 srcCol.w());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform failed");

			glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Attributes failed");

			glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

			// Check the result to see that extension was actually enabled.
			glw::GLubyte result[4] = { 1, 2, 3, 4 };
			gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, result);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");
			bool pass = tcu::RGBA::fromBytes(result) == tcu::RGBA(0, 0, 0, 0xFF);
			m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");

			return STOP;
		}